

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O1

bool Cmd::iequals(string_view a,string_view b)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  difference_type __d1;
  bool bVar6;
  
  sVar4 = a._M_len;
  if (sVar4 != b._M_len) {
    return false;
  }
  bVar6 = sVar4 == 0;
  if (!bVar6) {
    bVar1 = *b._M_str;
    iVar2 = tolower((uint)(byte)*a._M_str);
    iVar3 = tolower((uint)bVar1);
    if (iVar2 == iVar3) {
      sVar5 = 1;
      do {
        if (sVar4 == sVar5) {
          return sVar4 == sVar5;
        }
        bVar1 = b._M_str[sVar5];
        iVar2 = tolower((uint)(byte)a._M_str[sVar5]);
        iVar3 = tolower((uint)bVar1);
        sVar5 = sVar5 + 1;
      } while (iVar2 == iVar3);
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

static bool iequals(std::string_view a, std::string_view b) {
		if (a.size() != b.size()) {
			return false;
		}

		return std::equal(a.begin(), a.end(), b.begin(), b.end(), [](unsigned char a, unsigned char b) {
			return tolower(a) == tolower(b);
		});
	}